

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O3

void __thiscall r_exec::HLPController::EEntry::EEntry(EEntry *this,_Fact *evidence,_Fact *payload)

{
  atomic_int_fast64_t *paVar1;
  
  (this->evidence).object = (_Object *)evidence;
  if (evidence != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(evidence->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
              .super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  load_data(this,payload);
  return;
}

Assistant:

HLPController::EEntry::EEntry(_Fact *evidence, _Fact *payload): evidence(evidence)
{
    load_data(payload);
}